

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_additions_with_controls_Test
::
~SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_additions_with_controls_Test
          (SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_additions_with_controls_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_may_combine_subscription_set_additions_with_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::vector<Subject> subjects_set1 = {SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_EQ(subjects_set1, subject_register.NextSubscriptionSync()->GetSubjects());

    subject_register.Register(SS_SUBJECT1, true); // forces refresh
    subject_register.Register(SS_SUBJECT0, false); // new addition to subscription set
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false); // forces toggle unsubscribe and subscribe

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    std::vector<Subject> subjects_set2 = {SS_SUBJECT0, SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_TRUE(message->IsChangedEdition());
    EXPECT_EQ(subjects_set2, message->GetSubjects());

    auto controls = message->GetControls();
    EXPECT_EQ(ControlOperationEnum::REFRESH, controls.find(1)->second);
    EXPECT_EQ(ControlOperationEnum::TOGGLE, controls.find(3)->second);

}